

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> * __thiscall
density::
conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
::start_reentrant_emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
          (reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> *__return_storage_ptr__
          ,conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
           *this,TestObject<128UL,_8UL> *i_construction_params)

{
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_88;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_58;
  undefined1 local_40 [8];
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> put_transaction;
  lock_guard<std::mutex> lock;
  TestObject<128UL,_8UL> *i_construction_params_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&put_transaction.m_put_data.m_user_storage,(mutex_type *)this
            );
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::
  start_reentrant_emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
            (&local_58,
             (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
              *)(this + 0x28),i_construction_params);
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::reentrant_put_transaction<density_tests::TestObject<128ul,8ul>>::
  reentrant_put_transaction<density_tests::TestObject<128ul,8ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<128ul,8ul>> *)local_40,&local_58);
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_58);
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::reentrant_put_transaction
            (&local_88,0,
             (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
              *)this,(reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> *)local_40);
  reentrant_put_transaction<density_tests::TestObject<128ul,8ul>>::
  reentrant_put_transaction<density_tests::TestObject<128ul,8ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<128ul,8ul>> *)
             __return_storage_ptr__,&local_88);
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_88);
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> *)local_40);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)&put_transaction.m_put_data.m_user_storage);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }